

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Storyboard.cpp
# Opt level: O2

Storyboard * __thiscall
ApprovalTests::Storyboard::addFrames
          (Storyboard *this,int numberOfFrames,
          function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int)>
          *function)

{
  int iVar1;
  int __args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_48;
  
  iVar1 = 0;
  if (0 < numberOfFrames) {
    iVar1 = numberOfFrames;
  }
  for (__args = 1; __args - iVar1 != 1; __args = __args + 1) {
    ::std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int)>
    ::operator()(&bStack_48,function,__args);
    addFrame(this,&bStack_48);
    ::std::__cxx11::string::~string((string *)&bStack_48);
  }
  return this;
}

Assistant:

Storyboard& Storyboard::addFrames(int numberOfFrames,
                                      const std::function<std::string(int)>& function)
    {
        for (int frame = 1; frame <= numberOfFrames; ++frame)
        {
            addFrame(function(frame));
        }
        return *this;
    }